

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

int __thiscall QAccessibleTree::childCount(QAccessibleTree *this)

{
  QTreeView *pQVar1;
  QAbstractItemModel *this_00;
  QHeaderView *pQVar2;
  QTreeViewPrivate *pQVar3;
  qsizetype qVar4;
  QAccessibleTable *in_RDI;
  long in_FS_OFFSET;
  int hHeader;
  QAbstractItemModel *theModel;
  QTreeView *treeView;
  int local_24;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleTable::view((QAccessibleTable *)0x7f755a);
  pQVar1 = qobject_cast<QTreeView_const*>((QObject *)0x7f7562);
  if (pQVar1 == (QTreeView *)0x0) {
    local_24 = 0;
  }
  else {
    this_00 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
    if (this_00 == (QAbstractItemModel *)0x0) {
      local_24 = 0;
    }
    else {
      pQVar2 = QAccessibleTable::horizontalHeader(in_RDI);
      pQVar3 = QTreeView::d_func((QTreeView *)0x7f75c9);
      qVar4 = QList<QTreeViewItem>::size(&pQVar3->viewItems);
      QAbstractItemView::rootIndex((QAbstractItemView *)this_00);
      local_24 = (**(code **)(*(long *)this_00 + 0x80))(this_00,local_20);
      local_24 = ((int)qVar4 + (uint)(pQVar2 != (QHeaderView *)0x0)) * local_24;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTree::childCount() const
{
    const QTreeView *treeView = qobject_cast<const QTreeView*>(view());
    if (!treeView)
        return 0;
    const QAbstractItemModel *theModel = treeView->model();
    if (!theModel)
        return 0;

    int hHeader = horizontalHeader() ? 1 : 0;
    return (treeView->d_func()->viewItems.size() + hHeader)
            * theModel->columnCount(treeView->rootIndex());
}